

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns_Switch.c
# Opt level: O3

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *udata)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  
  pdVar2 = *(double **)((long)y->content + 0x10);
  dVar4 = pdVar2[1];
  dVar3 = *(double *)((long)udata + 0x18) * dVar4 * pdVar2[2] -
          *(double *)((long)udata + 0x10) * *pdVar2;
  pdVar2 = *(double **)((long)ydot->content + 0x10);
  dVar1 = *(double *)((long)udata + 0x20);
  *pdVar2 = dVar3;
  dVar4 = dVar1 * dVar4 * dVar4;
  pdVar2[2] = dVar4;
  pdVar2[1] = -dVar3 - dVar4;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* udata)
{
  sunrealtype y1, y2, y3, yd1, yd3;
  UserData data;
  sunrealtype p1, p2, p3;

  y1   = NV_Ith_S(y, 0);
  y2   = NV_Ith_S(y, 1);
  y3   = NV_Ith_S(y, 2);
  data = (UserData)udata;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  yd1 = NV_Ith_S(ydot, 0) = -p1 * y1 + p2 * y2 * y3;
  yd3 = NV_Ith_S(ydot, 2) = p3 * y2 * y2;
  NV_Ith_S(ydot, 1)       = -yd1 - yd3;

  return (0);
}